

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::uhugeint_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  value_type vVar6;
  sel_t *psVar7;
  const_reference pvVar8;
  idx_t iVar9;
  SelectionVector *pSVar10;
  idx_t iVar11;
  idx_t iVar12;
  uchar **rhs_locations;
  idx_t entry_idx;
  bool bVar13;
  SelectionVector *lhs_sel;
  idx_t local_78;
  uhugeint_t local_48;
  
  puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar3 = (lhs_format->unified).sel;
  pdVar4 = (lhs_format->unified).data;
  pdVar5 = rhs_row_locations->data;
  pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar6 = *pvVar8;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_78 = 0;
      iVar11 = 0;
      do {
        iVar12 = iVar11;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar12 = (idx_t)sel->sel_vector[iVar11];
        }
        psVar7 = pSVar3->sel_vector;
        iVar9 = iVar12;
        if (psVar7 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar7[iVar12];
        }
        puVar1 = (uint64_t *)(*(long *)(pdVar5 + iVar12 * 8) + vVar6);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar5 + iVar12 * 8) + (col_idx >> 3))) == 0) ||
           (bVar13 = uhugeint_t::operator>(&local_48,(uhugeint_t *)(pdVar4 + iVar9 * 0x10)), !bVar13
           )) {
          iVar9 = *no_match_count;
          *no_match_count = iVar9 + 1;
          pSVar10 = no_match_sel;
        }
        else {
          iVar9 = local_78;
          pSVar10 = sel;
          local_78 = local_78 + 1;
        }
        pSVar10->sel_vector[iVar9] = (sel_t)iVar12;
        iVar11 = iVar11 + 1;
      } while (count != iVar11);
      return local_78;
    }
  }
  else if (count != 0) {
    local_78 = 0;
    iVar11 = 0;
    do {
      iVar12 = iVar11;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)sel->sel_vector[iVar11];
      }
      psVar7 = pSVar3->sel_vector;
      iVar9 = iVar12;
      if (psVar7 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar7[iVar12];
      }
      puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar13 = false;
      }
      else {
        bVar13 = (puVar2[iVar9 >> 6] >> (iVar9 & 0x3f) & 1) == 0;
      }
      puVar1 = (uint64_t *)(*(long *)(pdVar5 + iVar12 * 8) + vVar6);
      local_48.lower = *puVar1;
      local_48.upper = puVar1[1];
      if (((bVar13) ||
          (((uint)*(byte *)(*(long *)(pdVar5 + iVar12 * 8) + (col_idx >> 3)) &
           1 << ((byte)col_idx & 7)) == 0)) ||
         (bVar13 = uhugeint_t::operator>(&local_48,(uhugeint_t *)(pdVar4 + iVar9 * 0x10)), !bVar13))
      {
        iVar9 = *no_match_count;
        *no_match_count = iVar9 + 1;
        pSVar10 = no_match_sel;
      }
      else {
        iVar9 = local_78;
        pSVar10 = sel;
        local_78 = local_78 + 1;
      }
      pSVar10->sel_vector[iVar9] = (sel_t)iVar12;
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
    return local_78;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}